

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

Vec_Ptr_t * Llb_Nonlin4Multiply(DdManager *dd,DdNode *bCube,Vec_Ptr_t *vParts)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  DdNode *n;
  int iVar5;
  long lVar6;
  int iVar7;
  
  iVar7 = vParts->nSize;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < iVar7 - 1U) {
    iVar5 = iVar7;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar5 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if (0 < vParts->nSize) {
    lVar6 = 0;
    do {
      n = Cudd_bddAnd(dd,(DdNode *)vParts->pArray[lVar6],bCube);
      Cudd_Ref(n);
      uVar1 = pVVar3->nSize;
      uVar2 = pVVar3->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar2 * 2;
          if (iVar7 <= (int)uVar2) goto LAB_0082ab87;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = iVar7;
      }
LAB_0082ab87:
      pVVar3->nSize = uVar1 + 1;
      pVVar3->pArray[(int)uVar1] = n;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vParts->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4Multiply( DdManager * dd, DdNode * bCube, Vec_Ptr_t * vParts )
{
    Vec_Ptr_t * vNew;
    DdNode * bTemp, * bFunc;
    int i;
    vNew = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( DdNode *, vParts, bFunc, i )
    {
        bTemp = Cudd_bddAnd( dd, bFunc, bCube );  Cudd_Ref( bTemp );
        Vec_PtrPush( vNew, bTemp );
    }
    return vNew;
}